

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O3

void NES_DMC_np_Reset(void *chip)

{
  uint uVar1;
  ulong uVar2;
  NES_DMC *dmc;
  int iVar3;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  InitializeTNDTable((NES_DMC *)chip,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da),in_XMM1_Qa,in_XMM2_Qa);
  *(undefined8 *)((long)chip + 0x400b0) = 0;
  *(undefined8 *)((long)chip + 0x400b8) = 0;
  *(undefined8 *)((long)chip + 0x400c0) = 0x1ac00000004;
  *(undefined8 *)((long)chip + 0x400f8) = 0;
  *(undefined2 *)((long)chip + 0x40118) = 0;
  *(undefined4 *)((long)chip + 0x40108) = 0;
  *(undefined8 *)((long)chip + 0x400c8) = 0;
  *(undefined8 *)((long)chip + 0x400ce) = 0;
  *(undefined8 *)((long)chip + 0x400d8) = 0;
  *(undefined8 *)((long)chip + 0x400df) = 0;
  *(undefined8 *)((long)chip + 0x400e8) = 0;
  *(undefined8 *)((long)chip + 0x400ee) = 0;
  *(undefined8 *)((long)chip + 0x40110) = 0x400000000;
  iVar3 = -0xf;
  do {
    NES_DMC_np_Write(chip,(short)iVar3 + 0x4017,'\0');
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0);
  *(undefined2 *)((long)chip + 0x40118) = 0x100;
  *(undefined4 *)((long)chip + 0x40108) = 0;
  *(undefined8 *)((long)chip + 0x40110) = 0x400000001;
  *(undefined2 *)((long)chip + 0x400f4) = 0;
  *(undefined8 *)((long)chip + 0x400f8) = 0;
  *(undefined1 *)((long)chip + 0x400ac) = 0;
  *(undefined1 *)((long)chip + 0x40059) = 0;
  if (*(int *)((long)chip + 0x40008) != 0) {
    *(undefined2 *)((long)chip + 0x400f4) = 0x101;
    *(undefined1 *)((long)chip + 0x40059) = 0xf;
  }
  *(undefined8 *)((long)chip + 0x40070) = 0;
  *(undefined8 *)((long)chip + 0x40078) = 0;
  *(undefined2 *)((long)chip + 0x4008a) = 0;
  *(undefined1 *)((long)chip + 0x40090) = 0;
  *(undefined8 *)((long)chip + 0x40094) = 0;
  *(undefined4 *)((long)chip + 0x4008c) = 0;
  *(undefined1 *)((long)chip + 0x40088) = 1;
  *(undefined8 *)((long)chip + 0x40080) = 0x10000000000;
  *(undefined8 *)((long)chip + 0x4005c) = 0;
  *(undefined8 *)((long)chip + 0x400dc) = 0x200000001;
  if (*(int *)((long)chip + 0x4001c) != 0) {
    uVar1 = rand();
    *(uint *)((long)chip + 0x400dc) = *(uint *)((long)chip + 0x400dc) | uVar1;
    uVar1 = rand();
    *(uint *)((long)chip + 0x400b4) = -(uVar1 & 0x1ff);
  }
  if (*(int *)((long)chip + 0x40028) != 0) {
    uVar1 = rand();
    *(uint *)((long)chip + 0x400bc) = uVar1 & 0x1f;
    uVar1 = rand();
    *(uint *)((long)chip + 0x400b0) = -(uVar1 & 0x7ff);
  }
  uVar2 = 0xac44;
  if (*(uint *)((long)chip + 0x400a0) != 0) {
    uVar2 = (ulong)*(uint *)((long)chip + 0x400a0);
  }
  *(int *)((long)chip + 0x400a0) = (int)uVar2;
  *(ulong *)((long)chip + 0x40120) =
       (uVar2 >> 1 | (ulong)*(uint *)((long)chip + 0x4009c) << 0x20) / uVar2;
  *(undefined8 *)((long)chip + 0x40128) = 0;
  return;
}

Assistant:

void NES_DMC_np_Reset(void* chip)
{
	NES_DMC* dmc = (NES_DMC*)chip;
	int i;
	//dmc->mask = 0;

	InitializeTNDTable(dmc,8227,12241,22638);

	dmc->counter[0] = 0;
	dmc->counter[1] = 0;
	dmc->counter[2] = 0;
	dmc->tphase = 0;
	dmc->nfreq = wavlen_table[0][0];
	dmc->dfreq = freq_table[0][0];
	dmc->tri_freq = 0;
	dmc->linear_counter = 0;
	dmc->linear_counter_reload = 0;
	dmc->linear_counter_halt = 0;
	dmc->linear_counter_control = 0;
	dmc->noise_volume = 0;
	dmc->noise = 0;
	dmc->noise_tap = 0;
	dmc->envelope_loop = 0;
	dmc->envelope_disable = 0;
	dmc->envelope_write = 0;
	dmc->envelope_div_period = 0;
	dmc->envelope_div = 0;
	dmc->envelope_counter = 0;
	dmc->enable[0] = 0;
	dmc->enable[1] = 0;
	dmc->length_counter[0] = 0;
	dmc->length_counter[1] = 0;
	dmc->frame_irq = false;
	dmc->frame_irq_enable = false;
	dmc->frame_sequence_count = 0;
	dmc->frame_sequence_steps = 4;
	dmc->frame_sequence_step = 0;
	//cpu->UpdateIRQ(NES_CPU::IRQD_FRAME, false);

	for (i = 0; i < 0x0F; i++)
		NES_DMC_np_Write (dmc, 0x4008 + i, 0);
	NES_DMC_np_Write (dmc, 0x4017, 0x40);

	dmc->irq = false;
	NES_DMC_np_Write (dmc, 0x4015, 0x00);
	if (dmc->option[OPT_UNMUTE_ON_RESET])
		NES_DMC_np_Write (dmc, 0x4015, 0x0f);
	//cpu->UpdateIRQ(NES_CPU::IRQD_DMC, false);

	dmc->out[0] = dmc->out[1] = dmc->out[2] = 0;
	dmc->damp = 0;
	dmc->dmc_pop = false;
	dmc->dmc_pop_offset = 0;
	dmc->dmc_pop_follow = 0;
	dmc->dac_lsb = 0;
	dmc->data = 0x100;
	dmc->empty = true;
	dmc->adr_reg = 0;
	dmc->dlength = 0;
	dmc->len_reg = 0;
	dmc->daddress = 0;
	dmc->noise = 1;
	dmc->noise_tap = (1<<1);

	if (dmc->option[OPT_RANDOMIZE_NOISE])
	{
		dmc->noise |= rand();
		dmc->counter[1] = -(rand() & 511);
	}
	if (dmc->option[OPT_RANDOMIZE_TRI])
	{
		dmc->tphase = rand() & 31;
		dmc->counter[0] = -(rand() & 2047);
	}

	NES_DMC_np_SetRate(dmc, dmc->rate);
	RC_RESET(&dmc->tick_count);
}